

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void __thiscall
clickhouse::ColumnVector<double>::Append(ColumnVector<double> *this,ColumnRef *column)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  long lVar3;
  long local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  std::__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<clickhouse::Column,void>
            ((__shared_ptr<clickhouse::Column,(__gnu_cxx::_Lock_policy)2> *)&local_28,
             (__weak_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2> *)
             &((column->super___shared_ptr<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
              ->super_enable_shared_from_this<clickhouse::Column>);
  if (local_28 == 0) {
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar3 = 0;
  }
  else {
    lVar1 = __dynamic_cast(local_28,&Column::typeinfo,&typeinfo,0);
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    lVar3 = 0;
    if (lVar1 != 0) {
      lVar3 = lVar1;
      if (local_20 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        p_Var2 = local_20;
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_20->_M_use_count = local_20->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_20->_M_use_count = local_20->_M_use_count + 1;
        }
      }
    }
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  if (lVar3 != 0) {
    std::vector<double,std::allocator<double>>::
    _M_range_insert<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
              ((vector<double,std::allocator<double>> *)&this->data_,
               (this->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish,*(undefined8 *)(lVar3 + 0x28),
               *(undefined8 *)(lVar3 + 0x30));
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}